

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  uint16 uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  Regexp *pRVar5;
  int j;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer str;
  uint uVar9;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar10;
  bool bVar11;
  Rune r;
  char buf [4];
  int local_50;
  char local_4c [4];
  bool *local_48;
  Regexp **local_40;
  char *local_38;
  
  prefix->_M_string_length = 0;
  *(prefix->_M_dataplus)._M_p = '\0';
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  if (this->op_ == '\x05') {
    uVar4 = (ulong)this->nsub_;
    if (uVar4 < 2) {
      paVar10 = &this->field_5;
    }
    else {
      paVar10 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (uVar4 != 0) {
      lVar8 = -8;
      uVar7 = 1;
      do {
        if ((paVar10[uVar7 - 1].subone_)->op_ != '\x12') {
          if (uVar7 == 1) {
            return false;
          }
          pRVar5 = paVar10[uVar7 - 1].subone_;
          local_48 = foldcase;
          if (pRVar5->op_ == '\x03') {
            if ((byte)((pRVar5->field_7).field_0.max_ < 0x80 |
                      ((byte)pRVar5->parse_flags_ & 0x20) >> 5) == 1) {
              std::__cxx11::string::_M_replace_aux((ulong)prefix,prefix->_M_string_length,0,'\x01');
            }
            else {
              runetochar(local_4c,&(pRVar5->field_7).rune_);
              std::__cxx11::string::append((char *)prefix,(ulong)local_4c);
            }
          }
          else {
            if (pRVar5->op_ != '\x04') {
              return false;
            }
            iVar3 = (pRVar5->field_7).field_0.max_;
            if ((pRVar5->parse_flags_ & 0x20) == 0) {
              std::__cxx11::string::resize((ulong)prefix,(char)(iVar3 << 2));
              str = (prefix->_M_dataplus)._M_p;
              if ((pRVar5->field_7).field_0.max_ < 1) {
                cVar2 = (char)str;
              }
              else {
                lVar6 = 0;
                local_40 = suffix;
                do {
                  local_50 = *(int *)((long)&(((pRVar5->field_7).field_1.name_)->_M_dataplus)._M_p +
                                     lVar6 * 4);
                  if (local_50 < 0x80) {
                    *str = (char)local_50;
                    str = str + 1;
                  }
                  else {
                    local_38 = str;
                    iVar3 = runetochar(str,&local_50);
                    str = local_38 + iVar3;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < (pRVar5->field_7).field_0.max_);
                cVar2 = (char)(prefix->_M_dataplus)._M_p;
                suffix = local_40;
              }
              std::__cxx11::string::resize((ulong)prefix,(char)str - cVar2);
            }
            else {
              std::__cxx11::string::resize((ulong)prefix,(char)iVar3);
              if (0 < (pRVar5->field_7).field_0.max_) {
                lVar6 = 0;
                do {
                  (prefix->_M_dataplus)._M_p[lVar6] =
                       *(char *)((long)&(((pRVar5->field_7).field_1.name_)->_M_dataplus)._M_p +
                                lVar6 * 4);
                  lVar6 = lVar6 + 1;
                } while (lVar6 < (pRVar5->field_7).field_0.max_);
              }
            }
          }
          *local_48 = (bool)((byte)(paVar10[uVar7 - 1].subone_)->parse_flags_ & 1);
          uVar9 = (uint)uVar7;
          if (uVar9 < this->nsub_) {
            do {
              Incref(paVar10[uVar7].subone_);
              uVar7 = uVar7 + 1;
            } while (uVar7 < this->nsub_);
            pRVar5 = ConcatOrAlternate(kRegexpConcat,(Regexp **)((long)paVar10 - lVar8),
                                       this->nsub_ - uVar9,(uint)this->parse_flags_,false);
          }
          else {
            pRVar5 = (Regexp *)operator_new(0x28);
            uVar1 = this->parse_flags_;
            pRVar5->op_ = '\x02';
            pRVar5->simple_ = '\0';
            pRVar5->parse_flags_ = uVar1;
            pRVar5->ref_ = 1;
            *(undefined8 *)((long)&pRVar5->down_ + 6) = 0;
            *(undefined8 *)((long)&(pRVar5->field_7).field_3.cc_ + 6) = 0;
            *(undefined8 *)&pRVar5->nsub_ = 0;
            *(undefined8 *)((long)&pRVar5->field_5 + 6) = 0;
            *(undefined2 *)((long)&pRVar5->field_7 + 0xe) = 0;
          }
          *suffix = pRVar5;
          return true;
        }
        lVar8 = lVar8 + -8;
        bVar11 = uVar7 != uVar4;
        uVar7 = uVar7 + 1;
      } while (bVar11);
    }
  }
  return false;
}

Assistant:

bool Regexp::RequiredPrefix(string *prefix, bool *foldcase, Regexp** suffix) {
  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;
  if (op_ != kRegexpConcat)
    return false;

  // Some number of anchors, then a literal or concatenation.
  int i = 0;
  Regexp** sub = this->sub();
  while (i < nsub_ && sub[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;

  Regexp* re = sub[i];
  switch (re->op_) {
    default:
      return false;

    case kRegexpLiteralString:
      // Convert to string in proper encoding.
      if (re->parse_flags() & Latin1) {
        prefix->resize(re->nrunes_);
        for (int j = 0; j < re->nrunes_; j++)
          (*prefix)[j] = static_cast<char>(re->runes_[j]);
      } else {
        // Convert to UTF-8 in place.
        // Assume worst-case space and then trim.
        prefix->resize(re->nrunes_ * UTFmax);
        char *p = &(*prefix)[0];
        for (int j = 0; j < re->nrunes_; j++) {
          Rune r = re->runes_[j];
          if (r < Runeself)
            *p++ = static_cast<char>(r);
          else
            p += runetochar(p, &r);
        }
        prefix->resize(p - &(*prefix)[0]);
      }
      break;

    case kRegexpLiteral:
      if ((re->parse_flags() & Latin1) || re->rune_ < Runeself) {
        prefix->append(1, static_cast<char>(re->rune_));
      } else {
        char buf[UTFmax];
        prefix->append(buf, runetochar(buf, &re->rune_));
      }
      break;
  }
  *foldcase = (sub[i]->parse_flags() & FoldCase) != 0;
  i++;

  // The rest.
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub[j]->Incref();
    re = Concat(sub + i, nsub_ - i, parse_flags());
  } else {
    re = new Regexp(kRegexpEmptyMatch, parse_flags());
  }
  *suffix = re;
  return true;
}